

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O1

void test_2d_static<0ul,0ul,30ul,30ul>(void)

{
  long lVar1;
  bool *pbVar2;
  size_t true_idx;
  int dptr [900];
  bool *local_e70;
  bool *local_e68;
  bool *local_e60;
  long local_e58;
  bool *local_e50;
  bool local_e48 [3608];
  
  local_e48[0] = true;
  local_e68 = (bool *)CONCAT71(local_e68._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",local_e48,
             (bool *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68._0_4_ = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(int *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = false;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)CONCAT44(local_e68._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(int *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)local_e48,(unsigned_long *)&local_e68);
  local_e48[0] = true;
  local_e48[1] = true;
  local_e48[2] = false;
  local_e48[3] = false;
  local_e48[4] = false;
  local_e48[5] = false;
  local_e48[6] = false;
  local_e48[7] = false;
  local_e68 = (bool *)0x384;
  pbVar2 = local_e48;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
             (unsigned_long *)pbVar2,(unsigned_long *)&local_e68);
  local_e58 = 0;
  do {
    lVar1 = 0;
    local_e60 = pbVar2;
    do {
      local_e70 = (bool *)(local_e58 + lVar1);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e50 = local_e48 + (long)local_e68 * 4;
      local_e70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e70,(int **)&local_e50);
      pbVar2[0] = true;
      pbVar2[1] = false;
      pbVar2[2] = false;
      pbVar2[3] = false;
      local_e70 = (bool *)CONCAT44(local_e70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(int *)pbVar2,
                 (int *)&local_e70);
      lVar1 = lVar1 + 0x1e;
      pbVar2 = pbVar2 + 0x78;
    } while (lVar1 != 900);
    local_e58 = local_e58 + 1;
    pbVar2 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  pbVar2 = local_e48;
  local_e58 = 0;
  do {
    lVar1 = 0;
    local_e60 = pbVar2;
    do {
      local_e70 = (bool *)(local_e58 + lVar1);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e50 = local_e48 + (long)local_e68 * 4;
      local_e70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e70,(int **)&local_e50);
      lVar1 = lVar1 + 0x1e;
      pbVar2 = pbVar2 + 0x78;
    } while (lVar1 != 900);
    local_e58 = local_e58 + 1;
    pbVar2 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  pbVar2 = local_e48;
  local_e58 = 0;
  do {
    lVar1 = 0;
    local_e60 = pbVar2;
    do {
      local_e70 = (bool *)(local_e58 + lVar1);
      local_e68 = local_e70;
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (unsigned_long *)&local_e70,(unsigned_long *)&local_e68);
      local_e50 = local_e48 + (long)local_e68 * 4;
      local_e70 = pbVar2;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",
                 (int **)&local_e70,(int **)&local_e50);
      local_e70 = (bool *)CONCAT44(local_e70._4_4_,0x2a);
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x6a,"void test_2d_static() [N = 0UL, M = 0UL, X = 30UL, Y = 30UL]",(int *)pbVar2,
                 (int *)&local_e70);
      lVar1 = lVar1 + 0x1e;
      pbVar2 = pbVar2 + 0x78;
    } while (lVar1 != 900);
    local_e58 = local_e58 + 1;
    pbVar2 = local_e60 + 4;
  } while (local_e58 != 0x1e);
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}